

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_book.cc
# Opt level: O3

int __thiscall helix::order_book::remove(order_book *this,char *__filename)

{
  order *o;
  iterator iVar1;
  invalid_argument *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  o = *(order **)__filename;
  if (o->side == sell) {
    remove<std::map<unsigned_long,helix::price_level,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,helix::price_level>>>>
              (this,o,&this->_asks);
  }
  else {
    if (o->side != buy) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"invalid side: ","");
      std::operator+(&local_40,&local_60,o->side);
      std::invalid_argument::invalid_argument(this_00,(string *)&local_40);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    remove<std::map<unsigned_long,helix::price_level,std::greater<unsigned_long>,std::allocator<std::pair<unsigned_long_const,helix::price_level>>>>
              (this,o,&this->_bids);
  }
  iVar1 = boost::multi_index::detail::
          hashed_index<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::multi_index::detail::nth_layer<1,_helix::order,_boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_mpl_::na,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<helix::order>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
          ::erase(&(this->_orders).super_type,
                  *(hashed_index_node<boost::multi_index::detail::index_node_base<helix::order,_std::allocator<helix::order>_>_>
                    **)__filename);
  return (int)iVar1.node;
}

Assistant:

void order_book::remove(iterator& iter)
{
    auto && order = *iter;
    switch (order.side) {
    case side_type::buy: {
        remove(order, _bids);
        break;
    }
    case side_type::sell: {
        remove(order, _asks);
        break;
    }
    default:
        throw std::invalid_argument(std::string("invalid side: ") + static_cast<char>(order.side));
    }
    _orders.erase(iter);
}